

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 soft_float32_to_float64(float32 a,float_status *s)

{
  undefined4 uVar1;
  _Bool _Var2;
  float64 fVar3;
  FloatParts FVar4;
  FloatParts pr;
  FloatParts p;
  float_status *s_local;
  uint64_t uStack_a0;
  float32 a_local;
  uint64_t local_80;
  int32_t local_78;
  undefined4 uStack_74;
  FloatParts local_70;
  uint64_t local_18;
  
  FVar4 = float32_unpack_raw(a);
  FVar4 = sf_canonicalize(FVar4,&float32_params,s);
  local_18 = FVar4.frac;
  local_80 = local_18;
  local_78 = FVar4.exp;
  uStack_74 = FVar4._12_4_;
  uVar1 = uStack_74;
  uStack_74._0_1_ = FVar4.cls;
  _Var2 = is_nan((FloatClass)uStack_74);
  if (_Var2) {
    _Var2 = is_snan((FloatClass)uStack_74);
    uStack_74 = uVar1;
    if (_Var2) {
      s->float_exception_flags = s->float_exception_flags | 1;
      FVar4 = parts_silence_nan(FVar4,s);
      uStack_a0 = FVar4.frac;
      local_80 = uStack_a0;
      local_78 = FVar4.exp;
      uStack_74 = FVar4._12_4_;
    }
    uVar1 = uStack_74;
    if (s->default_nan_mode != '\0') {
      local_70 = parts_default_nan(s);
      goto LAB_012bc32f;
    }
  }
  uStack_74 = uVar1;
  local_70.cls = (FloatClass)uStack_74;
  local_70.sign = (_Bool)uStack_74._1_1_;
  local_70._14_2_ = uStack_74._2_2_;
  local_70.exp = local_78;
  local_70.frac = local_80;
LAB_012bc32f:
  FVar4 = round_canonical(local_70,s,&float64_params);
  fVar3 = float64_pack_raw(FVar4);
  return fVar3;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_float32_to_float64(float32 a, float_status *s)
{
    FloatParts p = float32_unpack_canonical(a, s);
    FloatParts pr = float_to_float(p, &float64_params, s);
    return float64_round_pack_canonical(pr, s);
}